

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDefaultInstanceInitializer
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  long lVar1;
  CppType CVar2;
  Descriptor *pDVar3;
  FieldGenerator *pFVar4;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  long lVar5;
  long lVar6;
  string name;
  string local_98;
  FieldGeneratorMap *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pDVar3 = this->descriptor_;
  if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6b) != '\0') {
    io::Printer::Print(printer,
                       "_$classname$_default_instance_.get_mutable()->set_default_instance(_$classname$_default_instance_.get_mutable());\n_$classname$_default_instance_.get_mutable()->InitAsDefaultInstance();\n"
                       ,"classname",&this->classname_);
    return;
  }
  local_78 = &this->field_generators_;
  lVar5 = 0;
  lVar6 = 0;
  do {
    if (*(int *)(pDVar3 + 0x2c) <= lVar6) {
      return;
    }
    lVar1 = *(long *)(pDVar3 + 0x30);
    if (*(int *)(lVar1 + 0x4c + lVar5) == 3) {
LAB_0027ae62:
      if (((*(long *)(lVar1 + 0x60 + lVar5) != 0) && ((this->options_).enforce_lite == false)) &&
         (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
        pFVar4 = FieldGeneratorMap::get
                           (local_78,(FieldDescriptor *)
                                     (*(long *)(this->descriptor_ + 0x30) + lVar5));
        (*pFVar4->_vptr_FieldGenerator[0xe])(pFVar4,printer);
      }
    }
    else {
      this_00 = (FieldDescriptor *)(lVar1 + lVar5);
      CVar2 = FieldDescriptor::cpp_type(this_00);
      if ((CVar2 != CPPTYPE_MESSAGE) ||
         ((*(long *)(lVar1 + 0x60 + lVar5) != 0 &&
          (((this->options_).enforce_lite != false ||
           (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 3))))))
      goto LAB_0027ae62;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      if ((*(long *)(lVar1 + 0x60 + lVar5) == 0) &&
         (*(char *)(*(long *)(lVar1 + 0x80 + lVar5) + 0x6f) != '\x01')) {
        std::operator+(&local_70,"_",&this->classname_);
        std::operator+(&local_50,&local_70,"_default_instance_.get_mutable()->");
      }
      else {
        std::operator+(&local_70,"_",&this->classname_);
        std::operator+(&local_50,&local_70,"_default_instance_.");
      }
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      FieldName_abi_cxx11_(&local_50,(cpp *)this_00,field);
      std::__cxx11::string::append((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_50);
      FieldMessageTypeName_abi_cxx11_(&local_50,(cpp *)this_00,field_00);
      io::Printer::Print(printer,
                         "$name$_ = const_cast< $type$*>(\n    $type$::internal_default_instance());\n"
                         ,"name",&local_98,"type",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_98);
    }
    lVar6 = lVar6 + 1;
    pDVar3 = this->descriptor_;
    lVar5 = lVar5 + 0xa8;
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateDefaultInstanceInitializer(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) {
    printer->Print(
        "_$classname$_default_instance_.get_mutable()->set_default_instance(_$"
        "classname$_default_instance_.get_mutable());\n"
        "_$classname$_default_instance_.get_mutable()->InitAsDefaultInstance();"
        "\n",
        "classname", classname_);
    return;
  }

  // The default instance needs all of its embedded message pointers
  // cross-linked to other default instances.  We can't do this initialization
  // in the constructor because some other default instances may not have been
  // constructed yet at that time.
  // TODO(kenton):  Maybe all message fields (even for non-default messages)
  //   should be initialized to point at default instances rather than NULL?
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        (field->containing_oneof() == NULL ||
         HasDescriptorMethods(descriptor_->file(), options_))) {
      string name;
      if (field->containing_oneof() || field->options().weak()) {
        name = "_" + classname_ + "_default_instance_.";
      } else {
        name = "_" + classname_ + "_default_instance_.get_mutable()->";
      }
      name += FieldName(field);
      printer->Print(
          "$name$_ = const_cast< $type$*>(\n"
          "    $type$::internal_default_instance());\n",
          // Vars.
          "name", name, "type", FieldMessageTypeName(field));
    } else if (field->containing_oneof() &&
               HasDescriptorMethods(descriptor_->file(), options_)) {
      field_generators_.get(descriptor_->field(i))
          .GenerateConstructorCode(printer);
    }
  }
}